

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

Vec_Str_t * Acb_GenerateInstance2(Vec_Ptr_t *vIns,Vec_Ptr_t *vOuts)

{
  char cVar1;
  Vec_Str_t *p;
  char *pcVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  int i;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  
  p = (Vec_Str_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  pcVar2 = (char *)malloc(100);
  p->pArray = pcVar2;
  uVar3 = 100;
  uVar7 = 0;
  do {
    cVar1 = "  patch p0 ("[uVar7];
    if (uVar7 == uVar3) {
      if ((int)uVar3 < 0x10) {
        if (pcVar2 == (char *)0x0) {
          pcVar2 = (char *)malloc(0x10);
        }
        else {
          pcVar2 = (char *)realloc(pcVar2,0x10);
        }
        uVar3 = 0x10;
      }
      else {
        uVar9 = uVar3 * 2;
        if (SBORROW4(uVar3,uVar9) != 0 < (int)uVar3) {
          uVar3 = uVar9;
          if (pcVar2 == (char *)0x0) {
            pcVar2 = (char *)malloc((ulong)uVar9);
          }
          else {
            pcVar2 = (char *)realloc(pcVar2,(ulong)uVar9);
          }
        }
      }
    }
    pcVar2[uVar7] = cVar1;
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0xc);
  p->nSize = 0xc;
  p->nCap = uVar3;
  p->pArray = pcVar2;
  if (0 < vOuts->nSize) {
    uVar7 = 0;
    do {
      pcVar2 = ",";
      if (uVar7 == 0) {
        pcVar2 = "";
      }
      Vec_StrPrintF(p,"%s .%s(t%d_%s)",pcVar2,vOuts->pArray[uVar7],uVar7 & 0xffffffff,
                    vOuts->pArray[uVar7]);
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)vOuts->nSize);
  }
  if (0 < vIns->nSize) {
    lVar4 = 0;
    do {
      Vec_StrPrintF(p,", .%s(%s)",vIns->pArray[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar4 < vIns->nSize);
  }
  uVar3 = p->nCap;
  uVar9 = p->nSize;
  pcVar2 = p->pArray;
  lVar8 = (long)(int)uVar9 << 0x20;
  lVar4 = 0;
  uVar6 = uVar9;
  do {
    uVar5 = uVar6;
    cVar1 = "\n  );\n\n"[lVar4 + 2];
    if (uVar5 == uVar3) {
      if ((int)uVar3 < 0x10) {
        if (pcVar2 == (char *)0x0) {
          pcVar2 = (char *)malloc(0x10);
        }
        else {
          pcVar2 = (char *)realloc(pcVar2,0x10);
        }
        uVar3 = 0x10;
      }
      else {
        uVar6 = uVar3 * 2;
        if (SBORROW4(uVar3,uVar6) != 0 < (int)uVar3) {
          uVar3 = uVar6;
          if (pcVar2 == (char *)0x0) {
            pcVar2 = (char *)malloc((ulong)uVar6);
          }
          else {
            pcVar2 = (char *)realloc(pcVar2,(ulong)uVar6);
          }
        }
      }
    }
    pcVar2[lVar4 + (int)uVar9] = cVar1;
    lVar4 = lVar4 + 1;
    uVar6 = uVar5 + 1;
    lVar8 = lVar8 + 0x100000000;
  } while (lVar4 != 5);
  p->nSize = uVar6;
  p->nCap = uVar3;
  p->pArray = pcVar2;
  if (uVar6 == uVar3) {
    if ((int)uVar3 < 0x10) {
      if (p->pArray == (char *)0x0) {
        pcVar2 = (char *)malloc(0x10);
      }
      else {
        pcVar2 = (char *)realloc(p->pArray,0x10);
      }
      uVar9 = 0x10;
    }
    else {
      uVar9 = uVar3 * 2;
      if (SBORROW4(uVar3,uVar9) == 0 < (int)uVar3) goto LAB_0039989f;
      if (p->pArray == (char *)0x0) {
        pcVar2 = (char *)malloc((ulong)uVar9);
      }
      else {
        pcVar2 = (char *)realloc(p->pArray,(ulong)uVar9);
      }
    }
    p->pArray = pcVar2;
    p->nCap = uVar9;
  }
LAB_0039989f:
  p->nSize = uVar5 + 2;
  p->pArray[lVar8 >> 0x20] = '\0';
  return p;
}

Assistant:

Vec_Str_t * Acb_GenerateInstance2( Vec_Ptr_t * vIns, Vec_Ptr_t * vOuts )
{
    char * pName; int i;
    Vec_Str_t * vStr = Vec_StrAlloc( 100 );
    Vec_StrAppend( vStr, "  patch p0 (" );
    Vec_PtrForEachEntry( char *, vOuts, pName, i )
        Vec_StrPrintF( vStr, "%s .%s(t%d_%s)", i ? ",":"", pName, i, pName );
    Vec_PtrForEachEntry( char *, vIns, pName, i )
        Vec_StrPrintF( vStr, ", .%s(%s)", pName, pName );
    Vec_StrAppend( vStr, " );\n\n" );
    Vec_StrPush( vStr, '\0' );
    return vStr;
}